

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock.c
# Opt level: O0

int sem_wait_nointr(sem_t *sem)

{
  int *piVar1;
  bool bVar2;
  int local_18;
  int local_14;
  int cs;
  int rc;
  sem_t *sem_local;
  
  _cs = sem;
  pthread_setcancelstate(1,&local_18);
  do {
    local_14 = sem_wait((sem_t *)_cs);
    bVar2 = false;
    if (local_14 < 0) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  pthread_setcancelstate(local_18,(int *)0x0);
  return local_14;
}

Assistant:

static int
sem_wait_nointr(sem_t *sem)
{
	int rc;
	int cs;
	(void)pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &cs);

	do {
		rc = sem_wait(sem);
	} while (rc < 0 && errno == EINTR);

	(void)pthread_setcancelstate(cs, NULL);

	return rc;
}